

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O1

bool __thiscall NDevice::isValid(NDevice *this)

{
  pointer pNVar1;
  pointer pNVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  char *__return_storage_ptr__;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *args_3;
  bool bVar6;
  bool bVar7;
  
  bVar6 = false;
  if ((((this->name)._M_string_length != 0) && (bVar6 = false, this->numBytes != -1)) &&
     (this->byteOffset != -1)) {
    pNVar1 = (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar2 = (this->channels).super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pNVar1 == pNVar2) {
      bVar6 = false;
    }
    else {
      lVar5 = (long)pNVar2 - (long)pNVar1 >> 6;
      uVar4 = (uint)lVar5;
      bVar6 = (int)uVar4 < 1;
      if (0 < (int)uVar4) {
        piVar3 = &pNVar1->type;
        args_3 = (vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)0x1;
        do {
          if ((long)args_3 - lVar5 == 1) {
            __return_storage_ptr__ =
                 "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            NetworkDataType::
            serializedata<std::__cxx11::string_const,int_const,int_const,std::vector<NDeviceChannel,std::allocator<NDeviceChannel>>const>
                      ((binarydata *)__return_storage_ptr__,(NetworkDataType *)(lVar5 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar5 + 0x28),(int *)(lVar5 + 0x2c),(int *)(lVar5 + 0x30),args_3);
            return SUB81(__return_storage_ptr__,0);
          }
          if (*(size_type *)(piVar3 + -8) == 0) {
            return bVar6;
          }
          if (piVar3[-2] == -1) {
            return bVar6;
          }
          if (*piVar3 == -1) {
            return bVar6;
          }
          if (piVar3[-1] == -1) {
            return bVar6;
          }
          bVar6 = (vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                  (ulong)(uVar4 & 0x7fffffff) <= args_3;
          piVar3 = piVar3 + 0x10;
          bVar7 = args_3 != (vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                            (ulong)(uVar4 & 0x7fffffff);
          args_3 = (vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                   ((long)&(args_3->
                           super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>).
                           _M_impl.super__Vector_impl_data._M_start + 1);
        } while (bVar7);
      }
    }
  }
  return bVar6;
}

Assistant:

bool NDevice::isValid() const {
    if (name.empty() || numBytes == -1 || byteOffset == -1 || channels.empty())
        return(false); // a device must have a name, a set numBytes, a set byteOffset, and at least one channel
    for (int i = 0; i < (int)channels.size(); i++) {
        if (!channels.at(i).isValid()) //make sure all channels are valid
            return(false);
    }
    return(true);
}